

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall
ON_NurbsCurve::GetNextDiscontinuity
          (ON_NurbsCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  double dVar1;
  bool bVar2;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  continuity cVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  uint uVar16;
  bool bVar17;
  ulong uVar18;
  long lVar19;
  double *t_00;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_3dVector D1p;
  ON_3dVector D1m;
  int tmp_dtype;
  int tmp_hint;
  ON_3dVector D2m;
  ON_3dVector D2p;
  double tmp_t;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  ON_3dVector local_168;
  ON_3dVector local_148;
  ON_3dVector local_128;
  ON_3dVector local_108;
  ulong local_f0;
  ON_3dVector local_e8;
  ON_3dVector local_d0;
  int local_b8 [2];
  ON_3dVector local_b0;
  ON_3dVector local_98;
  ON_3dVector local_80;
  double local_68;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_b8[1] = 0;
  local_b8[0] = 0;
  local_148.z = ON_3dVector::NanVector.z;
  local_148.x = ON_3dVector::NanVector.x;
  local_148.y = ON_3dVector::NanVector.y;
  local_168.z = ON_3dVector::NanVector.z;
  local_168.x = ON_3dVector::NanVector.x;
  local_168.y = ON_3dVector::NanVector.y;
  if (hint == (int *)0x0) {
    hint = local_b8 + 1;
  }
  if (dtype == (int *)0x0) {
    dtype = local_b8;
  }
  t_00 = &local_68;
  if (t != (double *)0x0) {
    t_00 = t;
  }
  if (c == C0_continuous) {
    return false;
  }
  dVar24 = t0;
  if (c == C0_locus_continuous) {
    c = C0_locus_continuous;
    goto LAB_005874ec;
  }
  if ((t0 != t1) || (NAN(t0) || NAN(t1))) {
    if (this->m_order < 3) {
      c = ON::PolylineContinuity(c);
    }
    cVar8 = ON::ParametricContinuity(c);
    if ((cVar8 < (Gsmooth_continuous|C0_continuous)) && ((0x1028U >> (cVar8 & 0x1f) & 1) != 0)) {
      iVar12 = this->m_order;
      bVar5 = 2 < iVar12;
      bVar15 = cVar8 != C2_continuous && bVar5;
      bVar17 = cVar8 == G1_continuous || bVar15;
      uVar16 = bVar5 | 2;
    }
    else {
      bVar17 = cVar8 == G1_continuous;
      iVar12 = this->m_order;
      uVar16 = 2;
      bVar15 = false;
      bVar5 = false;
    }
    bVar20 = cVar8 == Gsmooth_continuous;
    iVar13 = 0;
    if (cVar8 != Cinfinity_continuous) {
      iVar13 = uVar16 - iVar12;
    }
    iVar9 = ON_NurbsSpanIndex(iVar12,this->m_cv_count,this->m_knot,t0,(uint)(t0 <= t1) * 2 + -1,
                              *hint);
    pdVar11 = this->m_knot;
    dVar23 = (ABS(pdVar11[(long)iVar9 + 1] - pdVar11[iVar9]) +
             ABS(pdVar11[(long)iVar9 + 1]) + ABS(pdVar11[iVar9])) * 1.490116119385e-08;
    iVar12 = this->m_order;
    bVar2 = 3 < iVar12;
    iVar10 = iVar9 + iVar12;
    if (t0 < t1) {
      dVar25 = pdVar11[(long)iVar10 + -1];
      if ((((t0 < dVar25) && (dVar25 < t1)) && (dVar25 - t0 <= dVar23)) &&
         (iVar10 < this->m_cv_count)) {
        iVar9 = ON_NurbsSpanIndex(iVar12,this->m_cv_count,pdVar11,dVar25,1,*hint);
        dVar24 = dVar25;
      }
      if (bVar2 && bVar20) {
        bVar6 = SpanIsLinear(this,iVar9,1e-08,1e-08);
      }
      else {
        bVar6 = false;
      }
      *hint = iVar9;
      iVar12 = iVar9 + this->m_order + -2;
      uVar16 = this->m_cv_count;
      if (iVar12 < (int)(uVar16 - 1)) {
        pdVar11 = this->m_knot;
        uVar18 = (ulong)iVar12;
        iVar12 = ~uVar16 + iVar9 + this->m_order;
        do {
          if (dVar24 < pdVar11[uVar18]) {
            iVar12 = 1;
            goto LAB_0058790c;
          }
          uVar18 = uVar18 + 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
      }
      if (c != cVar8) {
        if (this->m_knot[(long)(int)uVar16 + -1] <= dVar24) {
          return false;
        }
        if (t1 < this->m_knot[(long)(int)uVar16 + -1]) {
          return false;
        }
        goto LAB_005874ec;
      }
    }
    else {
      if (((0 < iVar9) && (dVar25 = pdVar11[(long)iVar10 + -2], dVar25 < t0)) &&
         ((t1 < dVar25 && (t0 - dVar25 <= dVar23)))) {
        iVar9 = ON_NurbsSpanIndex(iVar12,this->m_cv_count,pdVar11,dVar25,-1,*hint);
        dVar24 = dVar25;
      }
      if (bVar2 && bVar20) {
        bVar6 = SpanIsLinear(this,iVar9,1e-08,1e-08);
      }
      else {
        bVar6 = false;
      }
      *hint = iVar9;
      iVar12 = this->m_order + -2;
      if (0 < iVar9) {
        pdVar11 = this->m_knot;
        uVar18 = (ulong)(iVar9 + iVar12);
        while (dVar24 <= pdVar11[uVar18]) {
          uVar18 = uVar18 - 1;
          if ((long)uVar18 <= (long)iVar12) goto LAB_005878bb;
        }
        iVar13 = -iVar13;
        iVar12 = -1;
LAB_0058790c:
        dVar23 = t1;
        if (dVar24 <= t1) {
          dVar23 = dVar24;
        }
        if ((pdVar11[(int)uVar18] <= dVar23) ||
           (dVar25 = (double)(~-(ulong)(t1 < dVar24) & (ulong)t1 |
                             -(ulong)(t1 < dVar24) & (ulong)dVar24), dVar25 <= pdVar11[(int)uVar18])
           ) {
LAB_00587f32:
          if (c == cVar8) {
            return false;
          }
          goto LAB_005874ec;
        }
        local_f0 = (ulong)((t0 < t1) + 1);
        while( true ) {
          iVar9 = (int)uVar18;
          if (t0 < t1) {
            iVar10 = this->m_cv_count + -1;
            if (iVar10 < iVar9) {
              iVar10 = iVar9;
            }
            lVar14 = (long)iVar9 + -1;
            do {
              if (lVar14 - iVar10 == -1) goto LAB_00587f32;
              lVar3 = lVar14 + 1;
              lVar19 = lVar14 + 1;
              lVar4 = lVar14 + 2;
            } while ((pdVar11[lVar3] == pdVar11[lVar4]) &&
                    (lVar14 = lVar19, !NAN(pdVar11[lVar3]) && !NAN(pdVar11[lVar4])));
          }
          else {
            lVar14 = (long)this->m_order + -2;
            if (iVar9 <= (int)lVar14) goto LAB_00587f32;
            lVar19 = (long)iVar9;
            while( true ) {
              if ((pdVar11[lVar19] != pdVar11[lVar19 + -1]) ||
                 (NAN(pdVar11[lVar19]) || NAN(pdVar11[lVar19 + -1]))) break;
              lVar19 = lVar19 + -1;
              if (lVar19 <= lVar14) goto LAB_00587f32;
            }
          }
          iVar9 = (int)lVar19;
          dVar1 = pdVar11[iVar9];
          uVar21 = SUB84(dVar1,0);
          uVar22 = (undefined4)((ulong)dVar1 >> 0x20);
          if ((dVar1 != pdVar11[iVar13 + iVar9]) || (NAN(dVar1) || NAN(pdVar11[iVar13 + iVar9])))
          goto LAB_00587f12;
          if (cVar8 == Cinfinity_continuous) {
            *dtype = 3;
            goto LAB_00587f92;
          }
          if (bVar5) {
            ON_Curve::Ev2Der(&this->super_ON_Curve,dVar1,&local_48,&local_d0,&local_98,-1,hint);
            ON_Curve::Ev2Der(&this->super_ON_Curve,this->m_knot[iVar9],&local_60,&local_e8,&local_80
                             ,1,hint);
          }
          else {
            ON_Curve::Ev1Der(&this->super_ON_Curve,dVar1,&local_48,&local_d0,-1,hint);
            ON_Curve::Ev1Der(&this->super_ON_Curve,this->m_knot[iVar9],&local_60,&local_e8,1,hint);
          }
          if (bVar17) break;
          ON_3dVector::operator-(&local_b0,&local_d0,&local_e8);
          dVar1 = ON_3dVector::MaximumCoordinate(&local_d0);
          bVar7 = ON_3dVector::IsTiny(&local_b0,dVar1 * 1.490116119385e-08);
          if (!bVar7) {
            *dtype = 1;
LAB_00587f6b:
            pdVar11 = this->m_knot;
            goto LAB_00587f88;
          }
          if (bVar5) {
            ON_3dVector::operator-(&local_b0,&local_98,&local_80);
            dVar1 = ON_3dVector::MaximumCoordinate(&local_98);
            bVar7 = ON_3dVector::IsTiny(&local_b0,dVar1 * 1.490116119385e-08);
            if (!bVar7) {
              *dtype = 2;
              goto LAB_00587f84;
            }
          }
LAB_00587f12:
          uVar18 = (ulong)(uint)(iVar9 + iVar12);
          pdVar11 = this->m_knot;
          if ((pdVar11[iVar9 + iVar12] <= dVar23) || (dVar25 <= pdVar11[iVar9 + iVar12]))
          goto LAB_00587f32;
        }
        if (bVar15) {
          ON_EvCurvature(&local_d0,&local_98,&local_108,&local_148);
          ON_EvCurvature(&local_e8,&local_80,&local_128,&local_168);
          dVar1 = ON_3dVector::operator*(&local_108,&local_128);
          if (cos_angle_tolerance <= dVar1) {
            if (cVar8 == Gsmooth_continuous) {
              Km_00.y = local_148.y;
              Km_00.x = local_148.x;
              Km_00.z = local_148.z;
              Kp_00.y = local_168.y;
              Kp_00.x = local_168.x;
              Kp_00.z = local_168.z;
              bVar7 = ON_IsGsmoothCurvatureContinuous
                                (Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
              if ((bVar7) &&
                 (bVar7 = ON_NurbsArcToArcTransitionIsNotGsmooth
                                    (this,iVar9,cos_angle_tolerance,curvature_tolerance), !bVar7)) {
LAB_00587e50:
                if ((bVar2 && bVar20) &&
                   (bVar7 = SpanIsLinear(this,((int)local_f0 + iVar9) - this->m_order,1e-08,1e-08),
                   bVar6 != bVar7)) {
                  *dtype = 3;
                  goto LAB_00587f84;
                }
                goto LAB_00587f12;
              }
            }
            else {
              Km_01.y = local_148.y;
              Km_01.x = local_148.x;
              Km_01.z = local_148.z;
              Kp_01.y = local_168.y;
              Kp_01.x = local_168.x;
              Kp_01.z = local_168.z;
              bVar7 = ON_IsG2CurvatureContinuous
                                (Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
              if (bVar7) goto LAB_00587e50;
            }
            *dtype = 2;
            goto LAB_00587f6b;
          }
        }
        else {
          local_108.z = local_d0.z;
          local_108.x = local_d0.x;
          local_108.y = local_d0.y;
          local_128.x = local_e8.x;
          local_128.y = local_e8.y;
          local_128.z = local_e8.z;
          ON_3dVector::Unitize(&local_108);
          ON_3dVector::Unitize(&local_128);
          dVar1 = ON_3dVector::operator*(&local_108,&local_128);
          if (cos_angle_tolerance <= dVar1) goto LAB_00587f12;
        }
        *dtype = 1;
LAB_00587f84:
        pdVar11 = this->m_knot;
LAB_00587f88:
        uVar21 = SUB84(pdVar11[iVar9],0);
        uVar22 = (undefined4)((ulong)pdVar11[iVar9] >> 0x20);
LAB_00587f92:
        *t_00 = (double)CONCAT44(uVar22,uVar21);
        return true;
      }
LAB_005878bb:
      if (c != cVar8) {
        if (dVar24 <= this->m_knot[iVar12]) {
          return false;
        }
        if (this->m_knot[iVar12] <= t1) {
          return false;
        }
LAB_005874ec:
        bVar5 = ON_Curve::GetNextDiscontinuity
                          (&this->super_ON_Curve,c,dVar24,t1,t_00,hint,dtype,cos_angle_tolerance,
                           curvature_tolerance);
        return bVar5;
      }
    }
  }
  return false;
}

Assistant:

bool ON_NurbsCurve::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  const double is_linear_tolerance = 1.0e-8;  
  const double is_linear_min_length = 1.0e-8;
  int tmp_hint = 0, tmp_dtype=0;
  double d, tmp_t;
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km(ON_3dVector::NanVector), Kp(ON_3dVector::NanVector);
  int ki;
  if ( !hint )
    hint = &tmp_hint;
  if ( !dtype )
    dtype = &tmp_dtype;
  if ( !t )
    t = &tmp_t;
  
  if ( c == ON::continuity::C0_continuous )
    return false;
  if ( c == ON::continuity::C0_locus_continuous )
  {
    return ON_Curve::GetNextDiscontinuity( c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }
  if ( t0 == t1 )
    return false;

  // First test for parametric discontinuities.  If none are found
  // then we will look for locus discontinuities at ends
  if ( m_order <= 2 )
    c = ON::PolylineContinuity((int)c); // no need to check 2nd derivatives that are zero
  const ON::continuity input_c = c;
  c = ON::ParametricContinuity((int)c);
  bool bEv2ndDer    = (c == ON::continuity::C2_continuous || c == ON::continuity::G2_continuous || c == ON::continuity::Gsmooth_continuous) && (m_order>2);
  bool bTestKappa   = ( bEv2ndDer && c != ON::continuity::C2_continuous );
  bool bTestTangent = ( bTestKappa || c == ON::continuity::G1_continuous );

  int delta_ki = 1;
  int delta = ((bEv2ndDer) ? 3 : 2) - m_order; // delta <= 0
  if ( ON::continuity::Cinfinity_continuous == c )
    delta = 0;

  ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,(t0>t1)?-1:1,*hint);
  double segtol = (fabs(m_knot[ki]) + fabs(m_knot[ki+1]) + fabs(m_knot[ki+1]-m_knot[ki]))*ON_SQRT_EPSILON;

  const bool bLineWiggleTest = (c == ON::continuity::Gsmooth_continuous && m_order >= 4);
  bool bSpanIsLinear = false;

  if ( t0 < t1 )
  {
    int ii = ki+m_order-2;
    if ( t0 < m_knot[ii+1] && t1 > m_knot[ii+1] && (m_knot[ii+1]-t0) <= segtol && ii+2 < m_cv_count )
    {
      t0 = m_knot[ii+1];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki < m_cv_count-1 && m_knot[ki] <= t0) 
      ki++;
    if (ki >= m_cv_count-1) 
    {
      if ( input_c != c && t0 < m_knot[m_cv_count-1] && t1 >= m_knot[m_cv_count-1] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
  }
  else
  {
    // (t0 > t1) work backwards
    int ii = ki+m_order-2;
    if ( t0 > m_knot[ii] && t1 < m_knot[ii] && (t0-m_knot[ii]) <= segtol && ii > m_order-2 )
    {
      t0 = m_knot[ii];
      ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t0,-1,*hint);
    }
    if ( bLineWiggleTest )
      bSpanIsLinear = SpanIsLinear(ki,is_linear_min_length,is_linear_tolerance);
    *hint = ki;
    ki += m_order-2;
    while (ki > m_order-2 && m_knot[ki] >= t0) 
      ki--;
    if (ki <= m_order-2) 
    {
      if ( input_c != c && t0 > m_knot[m_order-2] && t1 < m_knot[m_order-2] )
      {
        // have to do locus end test
        return ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
      }
      return false;
    }
    delta_ki = -1;
    delta = -delta;
  }

  double search_domain[2];
  if ( t0 <= t1 )
  {
    search_domain[0] = t0;
    search_domain[1] = t1;
  }
  else
  {
    search_domain[0] = t1;
    search_domain[1] = t0;
  }

  while ( search_domain[0] < m_knot[ki] && m_knot[ki] < search_domain[1] ) 
  {
    if ( delta_ki > 0 )
    {
      // t0 < t1 case
      while (ki < m_cv_count-1 && m_knot[ki] == m_knot[ki+1])
        ki++;
      if (ki >= m_cv_count-1) 
        break;    
    }
    else
    {
      // t0 > t1 case
      // 20 March 2003 Dale Lear:
      //     Added to make t0 > t1 case work
      while (ki > m_order-2 && m_knot[ki] == m_knot[ki-1])
        ki--;
      if (ki <= m_order-2) 
        break;    
    }

    if (m_knot[ki] == m_knot[ki+delta]) 
    {  
      if ( ON::continuity::Cinfinity_continuous == c )
      {
        // Cinfinity_continuous is treated as asking for the next knot
        *dtype = 3;
        *t = m_knot[ki];
        return true;
      }

      if ( bEv2ndDer ) {
        Ev2Der( m_knot[ki], Pm, D1m, D2m, -1, hint );
        Ev2Der( m_knot[ki], Pp, D1p, D2p,  1, hint );
      }
      else {
        Ev1Der( m_knot[ki], Pm, D1m, -1, hint );
        Ev1Der( m_knot[ki], Pp, D1p,  1, hint );
      }

      if ( bTestTangent )
      {
        if ( bTestKappa )
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
        }
        
        d = Tm*Tp;
        if ( d < cos_angle_tolerance )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        
        if ( bTestKappa )
        {
          bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
                  ? ON_IsGsmoothCurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance )
                  : ON_IsG2CurvatureContinuous( Km, Kp, cos_angle_tolerance, curvature_tolerance );
          if ( bIsCurvatureContinuous && ON::continuity::Gsmooth_continuous == c )
          {
            if ( ON_NurbsArcToArcTransitionIsNotGsmooth(*this,ki,cos_angle_tolerance,curvature_tolerance) )
              bIsCurvatureContinuous = false;
          }

          if ( !bIsCurvatureContinuous )
          {
            // NOTE:
            //   The test to enter this scope must exactly match
            //   the one used in ON_PolyCurve::GetNextDiscontinuity()
            //   and  ON_Curve::GetNextDiscontinuity().
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }
          if ( bLineWiggleTest )
          {
            if ( bSpanIsLinear != (( delta_ki < 0 )
                                  ? SpanIsLinear(ki - m_order + 1,is_linear_min_length,is_linear_tolerance)
                                  : SpanIsLinear(ki - m_order + 2,is_linear_min_length,is_linear_tolerance))
               )
            {
              // we are at a transition between a line segment and a wiggle
              *dtype = 3;
              *t = m_knot[ki];
              return true;
            }
          }
        }
      }
      else
      {
        if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
        {
          *dtype = 1;
          *t = m_knot[ki];
          return true;
        }
        else if ( bEv2ndDer )
        {
          if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            *dtype = 2;
            *t = m_knot[ki];
            return true;
          }         
        }
      }
    }
    ki += delta_ki;
  }

  // 20 March 2003 Dale Lear:
  //   If we get here, there are not discontinuities strictly between
  //   t0 and t1.
  bool rc = false;

  if ( input_c != c )
  {
    // use base class for consistent start/end locus testing 
    rc = ON_Curve::GetNextDiscontinuity( input_c, t0, t1, t, hint, dtype, 
                                    cos_angle_tolerance, curvature_tolerance );
  }

  return rc;
}